

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::BranchLayerParams::_InternalSerialize
          (BranchLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  ulong uVar2;
  int size;
  NeuralNetwork *pNVar3;
  uint8_t *puVar4;
  size_t __n;
  
  pNVar3 = this->ifbranch_;
  if (pNVar3 != (NeuralNetwork *)0x0 &&
      this != (BranchLayerParams *)_BranchLayerParams_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pNVar3 = this->ifbranch_;
    }
    *target = '\n';
    uVar1 = (pNVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = NeuralNetwork::_InternalSerialize(pNVar3,puVar4,stream);
  }
  pNVar3 = this->elsebranch_;
  if (pNVar3 != (NeuralNetwork *)0x0 &&
      this != (BranchLayerParams *)_BranchLayerParams_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pNVar3 = this->elsebranch_;
    }
    *target = '\x12';
    uVar1 = (pNVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = NeuralNetwork::_InternalSerialize(pNVar3,puVar4,stream);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffc;
    data = *(void **)(uVar2 + 8);
    size = (int)*(undefined8 *)(uVar2 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* BranchLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BranchLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NeuralNetwork ifBranch = 1;
  if (this->_internal_has_ifbranch()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::ifbranch(this), target, stream);
  }

  // .CoreML.Specification.NeuralNetwork elseBranch = 2;
  if (this->_internal_has_elsebranch()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::elsebranch(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BranchLayerParams)
  return target;
}